

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::io::Printer::PrintImpl(std::basic_string_view<char,std::char_traits<char>>,absl::lts_20250127::Span<std::__cxx11::string_const>,google::protobuf::io::Printer::PrintOptions)::__3,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  AlphaNum *in_R8;
  string_view src;
  string local_c8;
  AlphaNum local_a8;
  AlphaNum local_78;
  undefined8 local_48;
  char *local_40;
  
  local_48 = 0x15;
  local_40 = "undefined variable: \"";
  src._M_str = "undefined variable: \"";
  src._M_len = *(size_t *)(this + 8);
  CHexEscape_abi_cxx11_(&local_c8,*(lts_20250127 **)this,src);
  local_78.piece_._M_len = local_c8._M_string_length;
  local_78.piece_._M_str = local_c8._M_dataplus._M_p;
  local_a8.piece_._M_len = 1;
  local_a8.piece_._M_str = "\"";
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)&local_48,&local_78,&local_a8,in_R8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}